

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Subprocess.cpp
# Opt level: O0

pair<CommunicationPipesCreationError,_int>
createCommunicationPipes
          (ProcessAttributes *attr,PlatformSpecificPipesConfig *pipesConfig,
          ManagedDescriptor *outputPipeParentEnd,ManagedDescriptor *outputPipeChildEnd,
          ManagedDescriptor *controlPipeParentEnd,ManagedDescriptor *controlPipeChildEnd)

{
  int aiVar1 [2];
  int iVar2;
  FileDescriptor FVar3;
  FileDescriptor __newfd;
  int *piVar4;
  pair<CommunicationPipesCreationError,_int> pVar5;
  ManagedDescriptor *pMVar6;
  int local_68 [4];
  FileDescriptor FStack_58;
  int controlPipe [2];
  FileDescriptor FStack_4c;
  int outputPipe [2];
  posix_spawn_file_actions_t *fileActions;
  ManagedDescriptor *controlPipeChildEnd_local;
  ManagedDescriptor *controlPipeParentEnd_local;
  ManagedDescriptor *outputPipeChildEnd_local;
  ManagedDescriptor *outputPipeParentEnd_local;
  PlatformSpecificPipesConfig *pipesConfig_local;
  ProcessAttributes *attr_local;
  
  outputPipe = (int  [2])pipesConfig;
  if ((attr->connectToConsole & 1U) == 0) {
    posix_spawn_file_actions_addopen((posix_spawn_file_actions_t *)pipesConfig,0,"/dev/null",0,0);
    stack0xffffffffffffffb0 = 0xffffffffffffffff;
    iVar2 = llbuild::basic::sys::pipe(controlPipe + 1);
    if (iVar2 < 0) {
      controlPipe[0] = 1;
      piVar4 = __errno_location();
      pVar5 = std::make_pair<CommunicationPipesCreationError,int&>
                        ((CommunicationPipesCreationError *)controlPipe,piVar4);
      return pVar5;
    }
    pMVar6 = ManagedDescriptor::reset(outputPipeParentEnd,controlPipe + 1);
    ManagedDescriptor::childMayInherit(pMVar6,false);
    ManagedDescriptor::reset(outputPipeChildEnd,&FStack_4c);
    aiVar1 = outputPipe;
    FVar3 = ManagedDescriptor::unsafeDescriptor(outputPipeChildEnd);
    posix_spawn_file_actions_adddup2((posix_spawn_file_actions_t *)aiVar1,FVar3,1);
    aiVar1 = outputPipe;
    FVar3 = ManagedDescriptor::unsafeDescriptor(outputPipeChildEnd);
    posix_spawn_file_actions_adddup2((posix_spawn_file_actions_t *)aiVar1,FVar3,2);
    aiVar1 = outputPipe;
    FVar3 = ManagedDescriptor::unsafeDescriptor(outputPipeChildEnd);
    posix_spawn_file_actions_addclose((posix_spawn_file_actions_t *)aiVar1,FVar3);
  }
  else {
    posix_spawn_file_actions_adddup2((posix_spawn_file_actions_t *)pipesConfig,0,0);
    posix_spawn_file_actions_adddup2((posix_spawn_file_actions_t *)outputPipe,1,1);
    FVar3 = 2;
    posix_spawn_file_actions_adddup2((posix_spawn_file_actions_t *)outputPipe,2,2);
  }
  if ((attr->controlEnabled & 1U) != 0) {
    stack0xffffffffffffffa4 = 0xffffffffffffffff;
    iVar2 = llbuild::basic::sys::pipe(local_68 + 3);
    if (iVar2 < 0) {
      ManagedDescriptor::close(outputPipeParentEnd,FVar3);
      ManagedDescriptor::close(outputPipeChildEnd,FVar3);
      local_68[2] = 2;
      piVar4 = __errno_location();
      pVar5 = std::make_pair<CommunicationPipesCreationError,int&>
                        ((CommunicationPipesCreationError *)(local_68 + 2),piVar4);
      return pVar5;
    }
    pMVar6 = ManagedDescriptor::reset(controlPipeParentEnd,local_68 + 3);
    ManagedDescriptor::childMayInherit(pMVar6,false);
    ManagedDescriptor::reset(controlPipeChildEnd,&FStack_58);
    aiVar1 = outputPipe;
    FVar3 = ManagedDescriptor::unsafeDescriptor(controlPipeChildEnd);
    __newfd = ManagedDescriptor::unsafeDescriptor(controlPipeChildEnd);
    posix_spawn_file_actions_adddup2((posix_spawn_file_actions_t *)aiVar1,FVar3,__newfd);
  }
  local_68[1] = 0;
  local_68[0] = 0;
  pVar5 = std::make_pair<CommunicationPipesCreationError,int>
                    ((CommunicationPipesCreationError *)(local_68 + 1),local_68);
  return pVar5;
}

Assistant:

static std::pair<CommunicationPipesCreationError, int> createCommunicationPipes(const ProcessAttributes &attr,
        PlatformSpecificPipesConfig& pipesConfig,
        ManagedDescriptor& outputPipeParentEnd,
        ManagedDescriptor& outputPipeChildEnd,
        ManagedDescriptor& controlPipeParentEnd,
        ManagedDescriptor& controlPipeChildEnd) {
#if defined(_WIN32)
  STARTUPINFOW& startupInfo = pipesConfig;
  startupInfo.dwFlags = STARTF_USESTDHANDLES;
  if (attr.connectToConsole) {
    // Connect to the current stdout/stderr.
    startupInfo.hStdInput = GetStdHandle(STD_INPUT_HANDLE);
    startupInfo.hStdOutput = GetStdHandle(STD_OUTPUT_HANDLE);
    startupInfo.hStdError = GetStdHandle(STD_ERROR_HANDLE);
  } else {
    // Set NUL as stdin
    HANDLE nul =
      CreateFileW(L"NUL", GENERIC_READ, FILE_SHARE_READ | FILE_SHARE_WRITE,
                  NULL, OPEN_EXISTING, FILE_ATTRIBUTE_NORMAL, NULL);
    HANDLE outputPipe[2]{NULL, NULL};
    SECURITY_ATTRIBUTES secAttrs{sizeof(SECURITY_ATTRIBUTES), NULL, TRUE};
    if (CreatePipe(&outputPipe[0], &outputPipe[1], &secAttrs, 0) == 0) {
      return std::make_pair(CommunicationPipesCreationError::OUTPUT_PIPE_FAILED, errno);
    }
    startupInfo.hStdInput = nul;
    startupInfo.hStdOutput = outputPipe[1];
    startupInfo.hStdError = outputPipe[1];
    outputPipeParentEnd.reset(outputPipe[0]).childMayInherit(false);
    outputPipeChildEnd.reset(outputPipe[1]);
  }

  if (attr.controlEnabled) {
    HANDLE controlPipe[2]{NULL, NULL};
    SECURITY_ATTRIBUTES secAttrs{sizeof(SECURITY_ATTRIBUTES), NULL, TRUE};
    if (CreatePipe(&controlPipe[0], &controlPipe[1], &secAttrs, 0) == 0) {
      outputPipeParentEnd.close();
      outputPipeChildEnd.close();
      return std::make_pair(CommunicationPipesCreationError::OUTPUT_PIPE_FAILED, errno);
    }
    controlPipeParentEnd.reset(controlPipe[0]).childMayInherit(false);
    controlPipeChildEnd.reset(controlPipe[1]);
  }
#else

  posix_spawn_file_actions_t& fileActions = pipesConfig;

  // If we are capturing output, create a pipe and appropriate spawn actions.
  if (attr.connectToConsole) {
#ifdef __APPLE__
    posix_spawn_file_actions_addinherit_np(&fileActions, STDIN_FILENO);
#else
    posix_spawn_file_actions_adddup2(&fileActions, STDIN_FILENO, STDIN_FILENO);
#endif
    // Propagate the current stdout/stderr.
    posix_spawn_file_actions_adddup2(&fileActions, STDOUT_FILENO, STDOUT_FILENO);
    posix_spawn_file_actions_adddup2(&fileActions, STDERR_FILENO, STDERR_FILENO);
  } else {
    // Open /dev/null as stdin.
    posix_spawn_file_actions_addopen(&fileActions, STDIN_FILENO, "/dev/null", O_RDONLY, 0);

    int outputPipe[2]{ -1, -1 };
    if (basic::sys::pipe(outputPipe) < 0) {
      return std::make_pair(CommunicationPipesCreationError::OUTPUT_PIPE_FAILED, errno);
    }
    outputPipeParentEnd.reset(outputPipe[0]).childMayInherit(false);
    outputPipeChildEnd.reset(outputPipe[1]);

    // Open the write end of the pipe as stdout and stderr.
    // The code is safe.
    posix_spawn_file_actions_adddup2(&fileActions, outputPipeChildEnd.unsafeDescriptor(), STDOUT_FILENO);
    posix_spawn_file_actions_adddup2(&fileActions, outputPipeChildEnd.unsafeDescriptor(), STDERR_FILENO);

    // Close the child end of the pipe known under a different number.
    posix_spawn_file_actions_addclose(&fileActions, outputPipeChildEnd.unsafeDescriptor());
  }

  // Create a pipe for the process to (potentially) release the lane while
  // still running.
  if (attr.controlEnabled) {
    int controlPipe[2]{ -1, -1 };
    if (basic::sys::pipe(controlPipe) < 0) {
      outputPipeParentEnd.close();
      outputPipeChildEnd.close();
      return std::make_pair(CommunicationPipesCreationError::CONTROL_PIPE_FAILED, errno);
    }

    controlPipeParentEnd.reset(controlPipe[0]).childMayInherit(false);
    controlPipeChildEnd.reset(controlPipe[1]);

    // Make sure that the descriptor is properly inherited by the child.
    // The code is safe.
#ifdef __APPLE__
    posix_spawn_file_actions_addinherit_np(&fileActions, controlPipeChildEnd.unsafeDescriptor());
#else
    posix_spawn_file_actions_adddup2(&fileActions, controlPipeChildEnd.unsafeDescriptor(), controlPipeChildEnd.unsafeDescriptor());
#endif
  }

#endif

  return std::make_pair(CommunicationPipesCreationError::ERROR_NONE, 0);
}